

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int hasHotJournal(Pager *pPager,int *pExists)

{
  sqlite3_vfs *psVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_file *psVar3;
  int iVar4;
  int f;
  int exists;
  Pgno nPage;
  int locked;
  uint local_40;
  int local_3c;
  Pgno local_38;
  int local_34;
  
  psVar1 = pPager->pVfs;
  local_3c = 1;
  psVar2 = pPager->jfd->pMethods;
  iVar4 = 0;
  *pExists = 0;
  if (psVar2 == (sqlite3_io_methods *)0x0) {
    iVar4 = (*psVar1->xAccess)(psVar1,pPager->zJournal,0,&local_3c);
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  if (local_3c == 0) {
    return 0;
  }
  local_34 = 0;
  iVar4 = (*pPager->fd->pMethods->xCheckReservedLock)(pPager->fd,&local_34);
  if (iVar4 != 0 || local_34 != 0) {
    return iVar4;
  }
  iVar4 = pagerPagecount(pPager,&local_38);
  if (iVar4 != 0) {
    return iVar4;
  }
  if (local_38 != 0) {
    iVar4 = 0;
    if (psVar2 == (sqlite3_io_methods *)0x0) {
      local_40 = 0x801;
      iVar4 = (*psVar1->xOpen)(psVar1,pPager->zJournal,pPager->jfd,0x801,(int *)&local_40);
    }
    if (iVar4 != 0xe) {
      if (iVar4 != 0) {
        return iVar4;
      }
      local_40 = local_40 & 0xffffff00;
      iVar4 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_40,1,0);
      if (iVar4 == 0x20a) {
        iVar4 = 0;
      }
      if (psVar2 == (sqlite3_io_methods *)0x0) {
        psVar3 = pPager->jfd;
        if (psVar3->pMethods != (sqlite3_io_methods *)0x0) {
          (*psVar3->pMethods->xClose)(psVar3);
          psVar3->pMethods = (sqlite3_io_methods *)0x0;
        }
      }
      *pExists = (uint)((char)local_40 != '\0');
      return iVar4;
    }
    *pExists = 1;
    return 0;
  }
  if (sqlite3Hooks_0 != (code *)0x0) {
    (*sqlite3Hooks_0)();
  }
  if ((pPager->eLock < 6) && ((0x23U >> (pPager->eLock & 0x1f) & 1) != 0)) {
    iVar4 = (*pPager->fd->pMethods->xLock)(pPager->fd,2);
    if (iVar4 != 0) goto LAB_00132866;
    if (pPager->eLock != '\x05') {
      pPager->eLock = '\x02';
    }
  }
  (*psVar1->xDelete)(psVar1,pPager->zJournal,0);
  if (pPager->exclusiveMode == '\0') {
    psVar2 = pPager->fd->pMethods;
    if ((psVar2 != (sqlite3_io_methods *)0x0) &&
       ((*psVar2->xUnlock)(pPager->fd,1), pPager->eLock != '\x05')) {
      pPager->eLock = '\x01';
    }
  }
LAB_00132866:
  if (sqlite3Hooks_1 != (code *)0x0) {
    (*sqlite3Hooks_1)();
  }
  return 0;
}

Assistant:

static int hasHotJournal(Pager *pPager, int *pExists){
  sqlite3_vfs * const pVfs = pPager->pVfs;
  int rc = SQLITE_OK;           /* Return code */
  int exists = 1;               /* True if a journal file is present */
  int jrnlOpen = !!isOpen(pPager->jfd);

  assert( pPager->useJournal );
  assert( isOpen(pPager->fd) );
  assert( pPager->eState==PAGER_OPEN );

  assert( jrnlOpen==0 || ( sqlite3OsDeviceCharacteristics(pPager->jfd) &
    SQLITE_IOCAP_UNDELETABLE_WHEN_OPEN
  ));

  *pExists = 0;
  if( !jrnlOpen ){
    rc = sqlite3OsAccess(pVfs, pPager->zJournal, SQLITE_ACCESS_EXISTS, &exists);
  }
  if( rc==SQLITE_OK && exists ){
    int locked = 0;             /* True if some process holds a RESERVED lock */

    /* Race condition here:  Another process might have been holding the
    ** the RESERVED lock and have a journal open at the sqlite3OsAccess() 
    ** call above, but then delete the journal and drop the lock before
    ** we get to the following sqlite3OsCheckReservedLock() call.  If that
    ** is the case, this routine might think there is a hot journal when
    ** in fact there is none.  This results in a false-positive which will
    ** be dealt with by the playback routine.  Ticket #3883.
    */
    rc = sqlite3OsCheckReservedLock(pPager->fd, &locked);
    if( rc==SQLITE_OK && !locked ){
      Pgno nPage;                 /* Number of pages in database file */

      /* Check the size of the database file. If it consists of 0 pages,
      ** then delete the journal file. See the header comment above for 
      ** the reasoning here.  Delete the obsolete journal file under
      ** a RESERVED lock to avoid race conditions and to avoid violating
      ** [H33020].
      */
      rc = pagerPagecount(pPager, &nPage);
      if( rc==SQLITE_OK ){
        if( nPage==0 ){
          sqlite3BeginBenignMalloc();
          if( pagerLockDb(pPager, RESERVED_LOCK)==SQLITE_OK ){
            sqlite3OsDelete(pVfs, pPager->zJournal, 0);
            if( !pPager->exclusiveMode ) pagerUnlockDb(pPager, SHARED_LOCK);
          }
          sqlite3EndBenignMalloc();
        }else{
          /* The journal file exists and no other connection has a reserved
          ** or greater lock on the database file. Now check that there is
          ** at least one non-zero bytes at the start of the journal file.
          ** If there is, then we consider this journal to be hot. If not, 
          ** it can be ignored.
          */
          if( !jrnlOpen ){
            int f = SQLITE_OPEN_READONLY|SQLITE_OPEN_MAIN_JOURNAL;
            rc = sqlite3OsOpen(pVfs, pPager->zJournal, pPager->jfd, f, &f);
          }
          if( rc==SQLITE_OK ){
            u8 first = 0;
            rc = sqlite3OsRead(pPager->jfd, (void *)&first, 1, 0);
            if( rc==SQLITE_IOERR_SHORT_READ ){
              rc = SQLITE_OK;
            }
            if( !jrnlOpen ){
              sqlite3OsClose(pPager->jfd);
            }
            *pExists = (first!=0);
          }else if( rc==SQLITE_CANTOPEN ){
            /* If we cannot open the rollback journal file in order to see if
            ** its has a zero header, that might be due to an I/O error, or
            ** it might be due to the race condition described above and in
            ** ticket #3883.  Either way, assume that the journal is hot.
            ** This might be a false positive.  But if it is, then the
            ** automatic journal playback and recovery mechanism will deal
            ** with it under an EXCLUSIVE lock where we do not need to
            ** worry so much with race conditions.
            */
            *pExists = 1;
            rc = SQLITE_OK;
          }
        }
      }
    }
  }

  return rc;
}